

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O1

void apx_socketServerConnection_destroy(apx_socketServerConnection_t *self)

{
  if (self != (apx_socketServerConnection_t *)0x0) {
    apx_serverConnection_destroy();
    adt_bytearray_destroy(&self->send_buffer);
    apx_nodeManager_destroy(&self->node_manager);
    msocket_delete(self->socket_object);
    pthread_mutex_destroy((pthread_mutex_t *)&self->lock);
    return;
  }
  return;
}

Assistant:

void apx_socketServerConnection_destroy(apx_socketServerConnection_t *self)
{
   if (self != NULL)
   {
      apx_serverConnection_destroy(&self->base);
      adt_bytearray_destroy(&self->send_buffer);
      apx_nodeManager_destroy(&self->node_manager);
      SOCKET_DELETE(self->socket_object);
      MUTEX_DESTROY(self->lock);
   }
}